

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void bcd_put_digit(ppc_avr_t *bcd,uint8_t digit,int n)

{
  int iVar1;
  int n_local;
  uint8_t digit_local;
  ppc_avr_t *bcd_local;
  
  if ((n & 1U) == 0) {
    iVar1 = 0xf - (0xf - n / 2);
    bcd->u8[iVar1] = bcd->u8[iVar1] & 0xf0;
    iVar1 = 0xf - (0xf - n / 2);
    bcd->u8[iVar1] = bcd->u8[iVar1] | digit;
  }
  else {
    iVar1 = 0xf - (0xf - n / 2);
    bcd->u8[iVar1] = bcd->u8[iVar1] & 0xf;
    iVar1 = 0xf - (0xf - n / 2);
    bcd->u8[iVar1] = bcd->u8[iVar1] | digit << 4;
  }
  return;
}

Assistant:

static void bcd_put_digit(ppc_avr_t *bcd, uint8_t digit, int n)
{
    if (n & 1) {
        bcd->VsrB(BCD_DIG_BYTE(n)) &= 0x0F;
        bcd->VsrB(BCD_DIG_BYTE(n)) |= (digit << 4);
    } else {
        bcd->VsrB(BCD_DIG_BYTE(n)) &= 0xF0;
        bcd->VsrB(BCD_DIG_BYTE(n)) |= digit;
    }
}